

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::DepthGradientShader
          (DepthGradientShader *this,DataType outputType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderProgramDeclaration *pSVar2;
  long *plVar3;
  UniformSlot *pUVar4;
  long *plVar5;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  long *local_398;
  long local_390;
  long local_388;
  long lStack_380;
  long *local_378;
  long local_370;
  long local_368;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  long *local_358;
  long local_350;
  long local_348 [2];
  long *local_338;
  long local_330;
  long local_328 [2];
  long *local_318;
  long local_310;
  long local_308 [2];
  long *local_2f8;
  long local_2f0;
  long local_2e8 [2];
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  VertexSource local_298;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  FragmentOutput local_254;
  Uniform local_250;
  Uniform local_228;
  Uniform local_200;
  VertexAttribute local_1d8;
  VertexAttribute local_1b0;
  long *local_188 [2];
  long local_178 [2];
  FragmentSource local_168;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"a_position","");
  local_1b0.name._M_dataplus._M_p = (pointer)&local_1b0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_2b8,local_2b0 + (long)local_2b8);
  local_1b0.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_1b0);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"a_coord","");
  local_1d8.name._M_dataplus._M_p = (pointer)&local_1d8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_2d8,local_2d0 + (long)local_2d8);
  local_1d8.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1d8);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_148);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_254.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_254.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_254.type = GENERICVECTYPE_INT32;
  }
  else {
    local_254.type = GENERICVECTYPE_LAST;
  }
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_254);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"u_maxGradient","");
  local_200.name._M_dataplus._M_p = (pointer)&local_200.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_2f8,local_2f0 + (long)local_2f8);
  local_200.type = TYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_200);
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"u_minGradient","");
  local_228.name._M_dataplus._M_p = (pointer)&local_228.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_318,local_310 + (long)local_318);
  local_228.type = TYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_228);
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"u_color","");
  local_250.name._M_dataplus._M_p = (pointer)&local_250.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,local_338,local_330 + (long)local_338);
  local_250.type = TYPE_FLOAT_VEC4;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_250);
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_358,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_coord;\nout highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,"");
  local_298.source._M_dataplus._M_p = (pointer)&local_298.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_358,local_350 + (long)local_358);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_298);
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,
             "#version 300 es\nin highp vec4 v_coord;\nuniform highp float u_minGradient;\nuniform highp float u_maxGradient;\nuniform highp vec4 u_color;\nlayout(location = 0) out highp "
             ,"");
  glu::getDataTypeName(outputType);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_188);
  local_398 = &local_388;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_388 = *plVar5;
    lStack_380 = plVar3[3];
  }
  else {
    local_388 = *plVar5;
    local_398 = (long *)*plVar3;
  }
  local_390 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_398);
  local_3b8 = &local_3a8;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_3a8 = *plVar5;
    lStack_3a0 = plVar3[3];
  }
  else {
    local_3a8 = *plVar5;
    local_3b8 = (long *)*plVar3;
  }
  local_3b0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_3b8);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_268 = *plVar5;
    lStack_260 = plVar3[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *plVar5;
    local_278 = (long *)*plVar3;
  }
  local_270 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_278);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_368 = *plVar5;
    uStack_360 = (undefined4)plVar3[3];
    uStack_35c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_378 = &local_368;
  }
  else {
    local_368 = *plVar5;
    local_378 = (long *)*plVar3;
  }
  local_370 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar1 = &local_168.source.field_2;
  local_168.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_378,local_370 + (long)local_378);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_168);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.source._M_dataplus._M_p,
                    local_168.source.field_2._M_allocated_capacity + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398,local_388 + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.source._M_dataplus._M_p != &local_298.source.field_2) {
    operator_delete(local_298.source._M_dataplus._M_p,
                    local_298.source.field_2._M_allocated_capacity + 1);
  }
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.name._M_dataplus._M_p != &local_250.name.field_2) {
    operator_delete(local_250.name._M_dataplus._M_p,local_250.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.name._M_dataplus._M_p != &local_228.name.field_2) {
    operator_delete(local_228.name._M_dataplus._M_p,local_228.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.name._M_dataplus._M_p != &local_200.name.field_2) {
    operator_delete(local_200.name._M_dataplus._M_p,local_200.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
    operator_delete(local_1d8.name._M_dataplus._M_p,local_1d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.name._M_dataplus._M_p != &local_1b0.name.field_2) {
    operator_delete(local_1b0.name._M_dataplus._M_p,local_1b0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00d11510;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00d11548;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00d11560;
  *(DataType *)&(this->super_ShaderProgram).field_0x154 = outputType;
  pUVar4 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_minGradient");
  this->u_minGradient = pUVar4;
  pUVar4 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_maxGradient");
  this->u_maxGradient = pUVar4;
  pUVar4 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_color");
  this->u_color = pUVar4;
  return;
}

Assistant:

DepthGradientShader::DepthGradientShader (glu::DataType outputType)
	: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
					<< sglr::pdec::Uniform("u_maxGradient", glu::TYPE_FLOAT)
					<< sglr::pdec::Uniform("u_minGradient", glu::TYPE_FLOAT)
					<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::VertexSource(
							"#version 300 es\n"
							"in highp vec4 a_position;\n"
							"in highp vec4 a_coord;\n"
							"out highp vec4 v_coord;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"	v_coord = a_coord;\n"
							"}\n")
					<< sglr::pdec::FragmentSource(
							string(
								"#version 300 es\n"
								"in highp vec4 v_coord;\n"
								"uniform highp float u_minGradient;\n"
								"uniform highp float u_maxGradient;\n"
								"uniform highp vec4 u_color;\n"
								"layout(location = 0) out highp ") + glu::getDataTypeName(outputType) + " o_color;\n"
								"void main (void)\n"
								"{\n"
								"	highp float x = v_coord.x;\n"
								"	highp float y = v_coord.y;\n"
								"	highp float f0 = (x + y) * 0.5;\n"
								"	gl_FragDepth = u_minGradient + (u_maxGradient-u_minGradient)*f0;\n"
								"	o_color = " + glu::getDataTypeName(outputType) + "(u_color);\n"
								"}\n"))
	, m_outputType	(outputType)
	, u_minGradient	(getUniformByName("u_minGradient"))
	, u_maxGradient	(getUniformByName("u_maxGradient"))
	, u_color		(getUniformByName("u_color"))
{
}